

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

char * wabt::anon_unknown_0::CWriter::GetCTypeName(Type *type)

{
  Enum EVar1;
  Type *type_local;
  
  EVar1 = Type::operator_cast_to_Enum(type);
  switch(EVar1) {
  case ExnRef:
    type_local = (Type *)anon_var_dwarf_1a9e7c;
    break;
  default:
    abort();
  case ExternRef:
    type_local = (Type *)anon_var_dwarf_1a9e65;
    break;
  case FuncRef:
    type_local = (Type *)anon_var_dwarf_1a9e4e;
    break;
  case V128:
    type_local = (Type *)anon_var_dwarf_c8093;
    break;
  case F64:
    type_local = (Type *)0x23347b;
    break;
  case F32:
    type_local = (Type *)0x2334d3;
    break;
  case I64:
    type_local = (Type *)anon_var_dwarf_1a9e22;
    break;
  case I32:
    type_local = (Type *)anon_var_dwarf_1a9e17;
  }
  return (char *)type_local;
}

Assistant:

const char* CWriter::GetCTypeName(const Type& type) {
  // clang-format off
  switch (type) {
  case Type::I32: return "u32";
  case Type::I64: return "u64";
  case Type::F32: return "f32";
  case Type::F64: return "f64";
  case Type::V128: return "v128";
  case Type::FuncRef: return "wasm_rt_funcref_t";
  case Type::ExternRef: return "wasm_rt_externref_t";
  case Type::ExnRef: return "wasm_rt_exnref_t";
    default:
      WABT_UNREACHABLE;
  }
  // clang-format on
}